

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  undefined1 auVar1 [16];
  ImVec2 p_max;
  bool bVar2;
  byte *in_RSI;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  float pad_1;
  ImVec2 pad;
  ImU32 check_col;
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImRect *in_stack_fffffffffffffec0;
  ImDrawCornerFlags rounding_corners;
  undefined8 in_stack_fffffffffffffec8;
  ImVec2 *in_stack_fffffffffffffed0;
  ImRect *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  ImGuiID in_stack_fffffffffffffee4;
  float fVar10;
  undefined4 in_stack_fffffffffffffee8;
  float fVar11;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 hide_text_after_hash;
  float in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ImU32 col;
  bool *in_stack_ffffffffffffff08;
  ImDrawList *draw_list;
  ImVec2 pos_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined8 uVar12;
  float in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 local_a8;
  ImU32 local_a0;
  undefined8 in_stack_ffffffffffffff64;
  ImGuiNavHighlightFlags flags;
  ImGuiID in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  ImVec2 local_84;
  float fStack_78;
  float local_74;
  byte local_6b;
  byte local_6a;
  byte local_69;
  undefined1 local_68 [8];
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  undefined8 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte *local_18;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  flags = (ImGuiNavHighlightFlags)((ulong)in_stack_ffffffffffffff64 >> 0x20);
  local_18 = in_RSI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    uVar12 = 0;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (char *)in_stack_fffffffffffffed8,
                                  (char *)in_stack_fffffffffffffed0);
    auVar4._0_8_ = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ),SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0),
                                SUB84(in_stack_fffffffffffffed8,0));
    auVar4._8_56_ = extraout_var;
    local_3c = (ImDrawVert *)vmovlpd_avx(auVar4._0_16_);
    fVar3 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    if ((float)local_3c <= 0.0) {
      fVar11 = 0.0;
    }
    else {
      fVar11 = (local_30->ItemInnerSpacing).x + (float)local_3c;
    }
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                             ZEXT416((uint)(local_30->FramePadding).y),ZEXT416(local_3c._4_4_));
    pos_00 = (ImVec2)local_68;
    local_40 = fVar3;
    ImVec2::ImVec2((ImVec2 *)pos_00,fVar3 + fVar11,auVar1._0_4_);
    auVar5._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                               (ImVec2 *)0x469dbf);
    auVar5._8_56_ = extraout_var_00;
    local_60 = (ImVec2)vmovlpd_avx(auVar5._0_16_);
    ImRect::ImRect(&local_58,&local_48,&local_60);
    ItemSize(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    rounding_corners = (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    bVar2 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    if (bVar2) {
      local_6b = ButtonBehavior((ImRect *)CONCAT44(fVar11,in_stack_ffffffffffffff18),
                                (ImGuiID)pos_00.y,in_stack_ffffffffffffff08,
                                (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ),
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
      if ((bool)local_6b) {
        *local_18 = (*local_18 ^ 0xff) & 1;
        MarkItemEdited(local_34);
      }
      draw_list = (ImDrawList *)&stack0xffffffffffffff74;
      ImVec2::ImVec2((ImVec2 *)draw_list,local_40,local_40);
      auVar6._0_8_ = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                 (ImVec2 *)0x469eb9);
      auVar6._8_56_ = extraout_var_01;
      local_84 = (ImVec2)vmovlpd_avx(auVar6._0_16_);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffff84,&local_48,&stack0xffffffffffffff7c);
      RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c,flags);
      if (((local_6a & 1) == 0) || ((local_69 & 1) == 0)) {
        col = 7;
        if ((local_69 & 1) != 0) {
          col = 8;
        }
      }
      else {
        col = 9;
      }
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                  SUB84(in_stack_fffffffffffffed0,0));
      p_max.y = in_stack_ffffffffffffff2c;
      p_max.x = fVar3;
      RenderFrame(in_stack_ffffffffffffff30,p_max,(ImU32)((ulong)uVar12 >> 0x20),
                  SUB81((ulong)uVar12 >> 0x18,0),fVar11);
      local_a0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                             SUB84(in_stack_fffffffffffffed0,0));
      if (((local_20->DC).ItemFlags & 0x40U) == 0) {
        if ((*local_18 & 1) != 0) {
          auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(local_40 / 6.0)));
          fVar3 = ImMax<float>(1.0,auVar1._0_4_);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff34,fVar3,fVar3);
          auVar9._0_8_ = ::operator+((ImVec2 *)
                                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                     (ImVec2 *)0x46a14c);
          auVar9._8_56_ = extraout_var_04;
          vmovlpd_avx(auVar9._0_16_);
          vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar3),
                          ZEXT416((uint)local_40));
          RenderCheckMark(draw_list,pos_00,col,in_stack_ffffffffffffff00);
        }
      }
      else {
        fVar10 = 3.6;
        auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(local_40 / 3.6)));
        fVar11 = 1.0;
        fVar3 = ImMax<float>(1.0,auVar1._0_4_);
        auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(local_40 / fVar10)));
        fVar11 = ImMax<float>(fVar11,auVar1._0_4_);
        ImVec2::ImVec2(&local_a8,fVar3,fVar11);
        hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
        auVar7._0_8_ = ::operator+((ImVec2 *)
                                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                   (ImVec2 *)0x46a069);
        auVar7._8_56_ = extraout_var_02;
        vmovlpd_avx(auVar7._0_16_);
        auVar8._0_8_ = ::operator-((ImVec2 *)
                                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                   (ImVec2 *)0x46a084);
        auVar8._8_56_ = extraout_var_03;
        vmovlpd_avx(auVar8._0_16_);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(fVar10,in_stack_fffffffffffffee0),
                   &in_stack_fffffffffffffed8->Min,in_stack_fffffffffffffed0,
                   (ImU32)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (float)in_stack_fffffffffffffec8,rounding_corners);
      }
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)pos_00,(char *)draw_list,
                        (char *)CONCAT44(col,in_stack_ffffffffffffff00));
      }
      if (0.0 < (float)local_3c) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff2c,local_74 + (local_30->ItemInnerSpacing).x,
                       fStack_78 + (local_30->FramePadding).y);
        RenderText(pos_00,(char *)draw_list,(char *)CONCAT44(col,in_stack_ffffffffffffff00),
                   (bool)hide_text_after_hash);
      }
      local_1 = (bool)(local_6b & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    if (window->DC.ItemFlags & ImGuiItemFlags_MixedValue)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        ImVec2 pad(ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)), ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)));
        window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
    }
    else if (*v)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad*2.0f);
    }

    if (g.LogEnabled)
        LogRenderedText(&total_bb.Min, *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}